

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O1

void __thiscall crnlib::Resampler::restart(Resampler *this)

{
  long lVar1;
  Contrib_List *pCVar2;
  ulong uVar3;
  
  if (this->m_status != STATUS_OKAY) {
    return;
  }
  this->m_cur_src_y = 0;
  this->m_cur_dst_y = 0;
  if (0 < this->m_resample_src_y) {
    lVar1 = 0;
    do {
      this->m_Psrc_y_count[lVar1] = 0;
      this->m_Psrc_y_flag[lVar1] = '\0';
      lVar1 = lVar1 + 1;
    } while (lVar1 < this->m_resample_src_y);
  }
  if (0 < this->m_resample_dst_y) {
    lVar1 = 0;
    do {
      pCVar2 = this->m_Pclist_y;
      if (pCVar2[lVar1].n != 0) {
        uVar3 = 0;
        do {
          this->m_Psrc_y_count[pCVar2[lVar1].p[uVar3].pixel] =
               this->m_Psrc_y_count[pCVar2[lVar1].p[uVar3].pixel] + 1;
          uVar3 = uVar3 + 1;
          pCVar2 = this->m_Pclist_y;
        } while (uVar3 < pCVar2[lVar1].n);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < this->m_resample_dst_y);
  }
  lVar1 = 0;
  do {
    this->m_Pscan_buf->scan_buf_y[lVar1] = -1;
    crnlib_free(this->m_Pscan_buf->scan_buf_l[lVar1]);
    this->m_Pscan_buf->scan_buf_l[lVar1] = (Sample *)0x0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x4000);
  return;
}

Assistant:

void Resampler::restart() {
  if (STATUS_OKAY != m_status)
    return;

  m_cur_src_y = m_cur_dst_y = 0;

  int i, j;
  for (i = 0; i < m_resample_src_y; i++) {
    m_Psrc_y_count[i] = 0;
    m_Psrc_y_flag[i] = FALSE;
  }

  for (i = 0; i < m_resample_dst_y; i++) {
    for (j = 0; j < m_Pclist_y[i].n; j++)
      m_Psrc_y_count[resampler_range_check(m_Pclist_y[i].p[j].pixel, m_resample_src_y)]++;
  }

  for (i = 0; i < MAX_SCAN_BUF_SIZE; i++) {
    m_Pscan_buf->scan_buf_y[i] = -1;

    crnlib_free(m_Pscan_buf->scan_buf_l[i]);
    m_Pscan_buf->scan_buf_l[i] = NULL;
  }
}